

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O1

void XNA_SongInit(void)

{
  FAudioCreate(&songAudio,0,0xffffffff);
  FAudio_CreateMasteringVoice(songAudio,&songMaster,0,0,0,0,(FAudioEffectChain *)0x0);
  return;
}

Assistant:

FAUDIOAPI void XNA_SongInit()
{
	FAudioCreate(&songAudio, 0, FAUDIO_DEFAULT_PROCESSOR);
	FAudio_CreateMasteringVoice(
		songAudio,
		&songMaster,
		FAUDIO_DEFAULT_CHANNELS,
		FAUDIO_DEFAULT_SAMPLERATE,
		0,
		0,
		NULL
	);
}